

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool> *
__thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::insert
          (pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
           *__return_storage_ptr__,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,ValueT *val)

{
  pointer pvVar1;
  ulong uVar2;
  size_t bucketIdx;
  hashtable_iterator local_40;
  
  pvVar1 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)(long)val->first %
          (ulong)(((long)(this->mBuckets).
                         super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
  bucketIdx = uVar2;
  local_40.mCurValueItr = find_in_bucket(this,pvVar1 + uVar2,&val->first);
  __return_storage_ptr__->second = false;
  pvVar1 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_40.mCurValueItr._M_current ==
      *(pointer *)
       ((long)&pvVar1[uVar2].
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl + 8)) {
    local_40.mCurValueItr = insert_to_bucket(this,val,&bucketIdx);
    __return_storage_ptr__->second = true;
    pvVar1 = (this->mBuckets).
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = bucketIdx;
  }
  local_40.mCurBucketItr._M_current = pvVar1 + uVar2;
  local_40.mEndBucketItr._M_current =
       (this->mBuckets).
       super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  hashtable_iterator::to_next_data(&local_40);
  (__return_storage_ptr__->first).mEndBucketItr._M_current = local_40.mEndBucketItr._M_current;
  (__return_storage_ptr__->first).mCurValueItr._M_current = local_40.mCurValueItr._M_current;
  (__return_storage_ptr__->first).mCurBucketItr._M_current = local_40.mCurBucketItr._M_current;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator,bool> insert(const ValueT& val) {
      std::pair<iterator,bool> result;
      size_t bucketIdx = hash_to_bucket(val.first);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx], val.first);
      result.second = false;
      if (it == mBuckets[bucketIdx].end()) {
        it = insert_to_bucket(val, bucketIdx );
        result.second = true;
      }
      result.first = iterator(it,
                              mBuckets.begin()+bucketIdx,
                              mBuckets.end());
      return result;
    }